

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_cmd.c
# Opt level: O3

int cfg_cmd_handle_set(cfg_instance *instance,cfg_db *db,char *arg,autobuf *log)

{
  int iVar1;
  char *arg_00;
  cfg_entry *pcVar2;
  cfg_named_section *pcVar3;
  int iVar4;
  char *fmt;
  _Bool dummy;
  _parsed_argument pa;
  _Bool local_49;
  _parsed_argument local_48;
  
  arg_00 = strdup(arg);
  if (arg_00 == (char *)0x0) {
    return -1;
  }
  iVar1 = _do_parse_arg(arg_00,&local_48,log);
  iVar4 = -1;
  if (iVar1 != 0) goto LAB_0010b343;
  if (local_48.entry_value == (char *)0x0) {
    if (local_48.entry_key == (char *)0x0) {
      pcVar3 = _cfg_db_add_section(db,local_48.section_type,local_48.section_name,&local_49);
      if (pcVar3 != (cfg_named_section *)0x0) goto LAB_0010b311;
      fmt = "Cannot create section: \'%s\'\n";
    }
    else {
      fmt = "Key without value is not allowed for set command: %s";
    }
  }
  else {
    pcVar2 = cfg_db_set_entry_ext
                       (db,local_48.section_type,local_48.section_name,local_48.entry_key,
                        local_48.entry_value,true,true);
    if (pcVar2 != (cfg_entry *)0x0) {
LAB_0010b311:
      iVar4 = 0;
      goto LAB_0010b343;
    }
    fmt = "Cannot create entry: \'%s\'\n";
    iVar4 = 0;
  }
  cfg_append_printable_line(log,fmt,arg);
LAB_0010b343:
  free(arg_00);
  return iVar4;
}

Assistant:

int
cfg_cmd_handle_set(
  struct cfg_instance *instance __attribute__((unused)), struct cfg_db *db, const char *arg, struct autobuf *log) {
  struct _parsed_argument pa;
  char *ptr;
  bool dummy;
  int result;

  /* get temporary copy of argument string */
  ptr = strdup(arg);
  if (!ptr)
    return -1;

  /* prepare for cleanup */
  result = -1;

  if (_do_parse_arg(ptr, &pa, log)) {
    goto handle_set_cleanup;
  }

  if (pa.entry_value != NULL) {
    if (cfg_db_set_entry(db, pa.section_type, pa.section_name, pa.entry_key, pa.entry_value, true)) {
      result = 0;
    }
    else {
      cfg_append_printable_line(log, "Cannot create entry: '%s'\n", arg);
    }
    result = 0;
    goto handle_set_cleanup;
  }

  if (pa.entry_key != NULL) {
    cfg_append_printable_line(log, "Key without value is not allowed for set command: %s", arg);
    goto handle_set_cleanup;
  }

  /* set section */
  if (NULL == _cfg_db_add_section(db, pa.section_type, pa.section_name, &dummy)) {
    cfg_append_printable_line(log, "Cannot create section: '%s'\n", arg);
    goto handle_set_cleanup;
  }
  result = 0;

handle_set_cleanup:
  free(ptr);
  return result;
}